

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

int64_t get_time_t_min(void)

{
  intmax_t min_signed_time_t;
  uintmax_t max_signed_time_t;
  uintmax_t max_unsigned_time_t;
  
  return -0x8000000000000000;
}

Assistant:

static int64_t
get_time_t_min(void)
{
#if defined(TIME_T_MIN)
	return TIME_T_MIN;
#else
	if (((time_t)0) < ((time_t)-1)) {
		/* Time_t is unsigned */
		return (time_t)0;
	} else {
		/* Time_t is signed. */
		const uintmax_t max_unsigned_time_t = (uintmax_t)(~(time_t)0);
		const uintmax_t max_signed_time_t = max_unsigned_time_t >> 1;
		const intmax_t min_signed_time_t = (intmax_t)~max_signed_time_t;
		return (time_t)min_signed_time_t;
	}
#endif
}